

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O1

void __thiscall jrtplib::RTPExternalTransmitter::Destroy(RTPExternalTransmitter *this)

{
  RTPMemoryManager *pRVar1;
  
  if ((this->init == true) && (this->created == true)) {
    if (this->localhostname != (uint8_t *)0x0) {
      pRVar1 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      if (pRVar1 == (RTPMemoryManager *)0x0) {
        operator_delete__(this->localhostname);
      }
      else {
        (**(code **)(*(long *)pRVar1 + 0x18))();
      }
      this->localhostname = (uint8_t *)0x0;
      this->localhostnamelength = 0;
    }
    FlushPackets(this);
    this->created = false;
    if (this->waitingfordata == true) {
      RTPAbortDescriptors::SendAbortSignal(&this->m_abortDesc);
      this->m_abortCount = this->m_abortCount + 1;
    }
    RTPAbortDescriptors::Destroy(&this->m_abortDesc);
    return;
  }
  return;
}

Assistant:

void RTPExternalTransmitter::Destroy()
{
	if (!init)
		return;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK;
		return;
	}

	if (localhostname)
	{
		RTPDeleteByteArray(localhostname,GetMemoryManager());
		localhostname = 0;
		localhostnamelength = 0;
	}
	
	FlushPackets();
	created = false;
	
	if (waitingfordata)
	{
		m_abortDesc.SendAbortSignal();
		m_abortCount++;
		m_abortDesc.Destroy();
		MAINMUTEX_UNLOCK
		WAITMUTEX_LOCK // to make sure that the WaitForIncomingData function ended
		WAITMUTEX_UNLOCK
	}
	else
		m_abortDesc.Destroy();

	MAINMUTEX_UNLOCK
}